

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

DefinitionLookupResult * __thiscall
slang::ast::Compilation::getDefinition
          (DefinitionLookupResult *__return_storage_ptr__,Compilation *this,string_view lookupName,
          Scope *scope,ConfigRule *configRule,SourceRange sourceRange,DiagCode code)

{
  group_type_pointer pgVar1;
  RootSymbol *pRVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  byte bVar10;
  uint uVar11;
  Diagnostic *this_00;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  value_type_pointer __u;
  Symbol *pSVar16;
  undefined1 auVar17 [16];
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  byte bVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  byte bVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  byte bVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  SourceRange range;
  size_t seed;
  pointer local_a8;
  ulong local_98;
  ulong local_90;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> local_88;
  ConfigBlockSymbol *local_68;
  ConfigRule *pCStack_60;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  local_88.first.configRule = (ConfigRule *)lookupName._M_str;
  local_88.first.configRoot = (ConfigBlockSymbol *)lookupName._M_len;
  pRVar2 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  local_88.first.definition = (Symbol *)&pRVar2->super_Scope;
  if (pRVar2 == (RootSymbol *)0x0) {
    local_88.first.definition = (Symbol *)0x0;
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = seed;
  _seed = auVar8 << 0x40;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
  ::apply(&seed,(tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                 *)&local_88);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = seed;
  uVar15 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar7,0);
  uVar13 = uVar15 >> ((byte)(this->definitionMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar14 = (uVar15 & 0xff) * 4;
  uVar18 = (&UNK_004a938c)[lVar14];
  uVar19 = (&UNK_004a938d)[lVar14];
  uVar20 = (&UNK_004a938e)[lVar14];
  bVar21 = (&UNK_004a938f)[lVar14];
  uVar12 = 0;
  uVar22 = uVar18;
  uVar23 = uVar19;
  uVar24 = uVar20;
  bVar25 = bVar21;
  uVar26 = uVar18;
  uVar27 = uVar19;
  uVar28 = uVar20;
  bVar29 = bVar21;
  uVar30 = uVar18;
  uVar31 = uVar19;
  uVar32 = uVar20;
  bVar33 = bVar21;
  do {
    pgVar3 = (this->definitionMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar13;
    local_48 = pgVar1->m[0].n;
    uStack_47 = pgVar1->m[1].n;
    uStack_46 = pgVar1->m[2].n;
    bStack_45 = pgVar1->m[3].n;
    uStack_44 = pgVar1->m[4].n;
    uStack_43 = pgVar1->m[5].n;
    uStack_42 = pgVar1->m[6].n;
    bStack_41 = pgVar1->m[7].n;
    uStack_40 = pgVar1->m[8].n;
    uStack_3f = pgVar1->m[9].n;
    uStack_3e = pgVar1->m[10].n;
    bStack_3d = pgVar1->m[0xb].n;
    uStack_3c = pgVar1->m[0xc].n;
    uStack_3b = pgVar1->m[0xd].n;
    uStack_3a = pgVar1->m[0xe].n;
    bVar10 = pgVar1->m[0xf].n;
    auVar17[0] = -(local_48 == uVar18);
    auVar17[1] = -(uStack_47 == uVar19);
    auVar17[2] = -(uStack_46 == uVar20);
    auVar17[3] = -(bStack_45 == bVar21);
    auVar17[4] = -(uStack_44 == uVar22);
    auVar17[5] = -(uStack_43 == uVar23);
    auVar17[6] = -(uStack_42 == uVar24);
    auVar17[7] = -(bStack_41 == bVar25);
    auVar17[8] = -(uStack_40 == uVar26);
    auVar17[9] = -(uStack_3f == uVar27);
    auVar17[10] = -(uStack_3e == uVar28);
    auVar17[0xb] = -(bStack_3d == bVar29);
    auVar17[0xc] = -(uStack_3c == uVar30);
    auVar17[0xd] = -(uStack_3b == uVar31);
    auVar17[0xe] = -(uStack_3a == uVar32);
    auVar17[0xf] = -(bVar10 == bVar33);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    bStack_39 = bVar10;
    if (uVar11 != 0) {
      ppVar4 = (this->definitionMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
               .arrays.elements_;
      local_98 = uVar13;
      local_90 = uVar12;
      local_58 = uVar18;
      uStack_57 = uVar19;
      uStack_56 = uVar20;
      bStack_55 = bVar21;
      uStack_54 = uVar22;
      uStack_53 = uVar23;
      uStack_52 = uVar24;
      bStack_51 = bVar25;
      uStack_50 = uVar26;
      uStack_4f = uVar27;
      uStack_4e = uVar28;
      bStack_4d = bVar29;
      uStack_4c = uVar30;
      uStack_4b = uVar31;
      uStack_4a = uVar32;
      bStack_49 = bVar33;
      do {
        uVar6 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        __u = ppVar4 + uVar13 * 0xf + (ulong)uVar6;
        bVar9 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                ::__eq((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        *)&local_88,&__u->first);
        if (bVar9) {
          resolveConfigRules(&local_88,this,lookupName,scope,(ResolvedConfig *)0x0,configRule,
                             &(__u->second).first);
          local_68 = local_88.first.configRoot;
          pCStack_60 = local_88.first.configRule;
          pSVar16 = local_88.first.definition;
          goto LAB_002de539;
        }
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar10 = pgVar3[uVar13].m[0xf].n;
      uVar12 = local_90;
      uVar13 = local_98;
      uVar18 = local_58;
      uVar19 = uStack_57;
      uVar20 = uStack_56;
      bVar21 = bStack_55;
      uVar22 = uStack_54;
      uVar23 = uStack_53;
      uVar24 = uStack_52;
      bVar25 = bStack_51;
      uVar26 = uStack_50;
      uVar27 = uStack_4f;
      uVar28 = uStack_4e;
      bVar29 = bStack_4d;
      uVar30 = uStack_4c;
      uVar31 = uStack_4b;
      uVar32 = uStack_4a;
      bVar33 = bStack_49;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar10) == 0) break;
    uVar5 = (this->definitionMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::pair<std::vector<slang::ast::Symbol_*>,_bool>_>_>_>
            .arrays.groups_size_mask;
    lVar14 = uVar13 + uVar12;
    uVar12 = uVar12 + 1;
    uVar13 = lVar14 + 1U & uVar5;
  } while (uVar12 <= uVar5);
  _seed = (undefined1  [16])0x0;
  local_a8 = (pointer)0x0;
  resolveConfigRules(&local_88,this,lookupName,scope,(ResolvedConfig *)0x0,configRule,
                     (vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *)&seed);
  pSVar16 = local_88.first.definition;
  local_68 = local_88.first.configRoot;
  pCStack_60 = local_88.first.configRule;
  if (seed != 0) {
    operator_delete((void *)seed,(long)local_a8 - seed);
  }
LAB_002de539:
  if (((pSVar16 == (Symbol *)0x0) && (local_88.second == false)) &&
     (this_00 = errorMissingDef(this,lookupName,scope,sourceRange,code),
     this_00 != (Diagnostic *)0x0)) {
    range = slang::syntax::SyntaxNode::sourceRange((configRule->syntax).ptr);
    Diagnostic::addNote(this_00,(DiagCode)0x40001,range);
  }
  __return_storage_ptr__->definition = pSVar16;
  __return_storage_ptr__->configRoot = local_68;
  __return_storage_ptr__->configRule = pCStack_60;
  return __return_storage_ptr__;
}

Assistant:

Compilation::DefinitionLookupResult Compilation::getDefinition(std::string_view lookupName,
                                                               const Scope& scope,
                                                               const ConfigRule& configRule,
                                                               SourceRange sourceRange,
                                                               DiagCode code) const {
    std::pair<DefinitionLookupResult, bool> result;
    if (auto it = definitionMap.find({lookupName, root.get()}); it != definitionMap.end())
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, it->second.first);
    else
        result = resolveConfigRules(lookupName, scope, nullptr, &configRule, {});

    if (!result.first.definition && !result.second) {
        // No definition found and no error issued, so issue one ourselves.
        auto diag = errorMissingDef(lookupName, scope, sourceRange, code);
        if (diag)
            diag->addNote(diag::NoteConfigRule, configRule.syntax->sourceRange());
    }

    return result.first;
}